

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::setGlobal(CoreBroker *this,string_view valueName,string_view value)

{
  string_view string1;
  GlobalBrokerId id;
  ActionMessage *in_RCX;
  ActionMessage *in_RDI;
  CoreBroker *in_R8;
  ActionMessage querycmd;
  action_t in_stack_ffffffffffffff0c;
  ActionMessage *in_stack_ffffffffffffff10;
  GlobalFederateId in_stack_ffffffffffffff1c;
  
  ActionMessage::ActionMessage(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  id = CLI::std::atomic<helics::GlobalBrokerId>::load
                 ((atomic<helics::GlobalBrokerId> *)&in_RDI->dest_id,seq_cst);
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xffffffffffffff1c,id);
  SmallBuffer::operator=
            ((SmallBuffer *)CONCAT44(in_stack_ffffffffffffff1c.gid,id.gid),
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff10);
  string1._M_str = (char *)in_R8;
  string1._M_len = (size_t)in_RCX;
  ActionMessage::setStringData(in_RDI,string1);
  transmitToParent(in_R8,in_RCX);
  ActionMessage::~ActionMessage(in_RDI);
  return;
}

Assistant:

void CoreBroker::setGlobal(std::string_view valueName, std::string_view value)
{
    ActionMessage querycmd(CMD_SET_GLOBAL);
    querycmd.source_id = global_id.load();
    querycmd.payload = valueName;
    querycmd.setStringData(value);
    transmitToParent(std::move(querycmd));
}